

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O3

string * __thiscall
spirv_cross::CompilerMSL::variable_decl_abi_cxx11_
          (string *__return_storage_ptr__,CompilerMSL *this,SPIRVariable *variable)

{
  if (variable->storage == StorageClassWorkgroup) {
    this->is_using_builtin_array = true;
  }
  CompilerGLSL::variable_decl_abi_cxx11_(__return_storage_ptr__,&this->super_CompilerGLSL,variable);
  if (variable->storage == StorageClassWorkgroup) {
    this->is_using_builtin_array = false;
  }
  return __return_storage_ptr__;
}

Assistant:

std::string CompilerMSL::variable_decl(const SPIRVariable &variable)
{
	if (variable.storage == StorageClassWorkgroup)
	{
		is_using_builtin_array = true;
	}
	std::string expr = CompilerGLSL::variable_decl(variable);
	if (variable.storage == StorageClassWorkgroup)
	{
		is_using_builtin_array = false;
	}
	return expr;
}